

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred.c
# Opt level: O0

void ihevc_weighted_pred_chroma_bi
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 wgt0_cb,WORD32 wgt0_cr,WORD32 off0_cb,WORD32 off0_cr,
               WORD32 wgt1_cb,WORD32 wgt1_cr,WORD32 off1_cb,WORD32 off1_cr,WORD32 shift,
               WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  byte bVar1;
  int iVar2;
  UWORD8 local_40;
  UWORD8 local_3c;
  UWORD8 local_38;
  UWORD8 local_34;
  WORD32 i4_tmp;
  WORD32 col;
  WORD32 row;
  WORD32 dst_strd_local;
  WORD32 src_strd2_local;
  WORD32 src_strd1_local;
  UWORD8 *pu1_dst_local;
  WORD16 *pi2_src2_local;
  WORD16 *pi2_src1_local;
  
  pu1_dst_local = pu1_dst;
  pi2_src2_local = pi2_src2;
  pi2_src1_local = pi2_src1;
  for (row = 0; row < ht; row = row + 1) {
    for (col = 0; SBORROW4(col,wd * 2) != col + wd * -2 < 0; col = col + 2) {
      bVar1 = (byte)shift;
      iVar2 = (off0_cb + off1_cb + 1 << (bVar1 - 1 & 0x1f)) +
              (pi2_src2_local[col] + lvl_shift2) * wgt1_cb +
              (pi2_src1_local[col] + lvl_shift1) * wgt0_cb;
      if (iVar2 >> (bVar1 & 0x1f) < 0x100) {
        if (iVar2 >> (bVar1 & 0x1f) < 0) {
          local_38 = (UWORD8)(0 >> (bVar1 & 0x1f));
        }
        else {
          local_38 = (UWORD8)(iVar2 >> (bVar1 & 0x1f));
        }
        local_34 = local_38;
      }
      else {
        local_34 = 0xff;
      }
      pu1_dst_local[col] = local_34;
      iVar2 = (off0_cr + off1_cr + 1 << (bVar1 - 1 & 0x1f)) +
              (pi2_src2_local[col + 1] + lvl_shift2) * wgt1_cr +
              (pi2_src1_local[col + 1] + lvl_shift1) * wgt0_cr;
      if (iVar2 >> (bVar1 & 0x1f) < 0x100) {
        if (iVar2 >> (bVar1 & 0x1f) < 0) {
          local_40 = (UWORD8)(0 >> (bVar1 & 0x1f));
        }
        else {
          local_40 = (UWORD8)(iVar2 >> (bVar1 & 0x1f));
        }
        local_3c = local_40;
      }
      else {
        local_3c = 0xff;
      }
      pu1_dst_local[col + 1] = local_3c;
    }
    pi2_src1_local = pi2_src1_local + src_strd1;
    pi2_src2_local = pi2_src2_local + src_strd2;
    pu1_dst_local = pu1_dst_local + dst_strd;
  }
  return;
}

Assistant:

void ihevc_weighted_pred_chroma_bi(WORD16 *pi2_src1,
                                   WORD16 *pi2_src2,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd1,
                                   WORD32 src_strd2,
                                   WORD32 dst_strd,
                                   WORD32 wgt0_cb,
                                   WORD32 wgt0_cr,
                                   WORD32 off0_cb,
                                   WORD32 off0_cr,
                                   WORD32 wgt1_cb,
                                   WORD32 wgt1_cr,
                                   WORD32 off1_cb,
                                   WORD32 off1_cr,
                                   WORD32 shift,
                                   WORD32 lvl_shift1,
                                   WORD32 lvl_shift2,
                                   WORD32 ht,
                                   WORD32 wd)
{
    WORD32 row, col;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col += 2)
        {
            i4_tmp = (pi2_src1[col] + lvl_shift1) * wgt0_cb;
            i4_tmp += (pi2_src2[col] + lvl_shift2) * wgt1_cb;
            i4_tmp += (off0_cb + off1_cb + 1) << (shift - 1);

            pu1_dst[col] = CLIP_U8(i4_tmp >> shift);

            i4_tmp = (pi2_src1[col + 1] + lvl_shift1) * wgt0_cr;
            i4_tmp += (pi2_src2[col + 1] + lvl_shift2) * wgt1_cr;
            i4_tmp += (off0_cr + off1_cr + 1) << (shift - 1);

            pu1_dst[col + 1] = CLIP_U8(i4_tmp >> shift);
        }

        pi2_src1 += src_strd1;
        pi2_src2 += src_strd2;
        pu1_dst += dst_strd;
    }
}